

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_ssim.cpp
# Opt level: O1

void basisu::gaussian_filter
               (imagef *dst,imagef *orig_img,uint32_t odd_filter_width,float sigma_sqr,bool wrapping
               ,uint32_t width_divisor,uint32_t height_divisor)

{
  ulong uVar1;
  float fVar2;
  uint32_t uVar3;
  uint uVar4;
  uint h;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  vec<4U,_float> *pvVar9;
  char *__function;
  int iVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint w;
  uint uVar14;
  uint uVar15;
  int iVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  vector2D<float> kernel;
  ulong local_e0;
  vector2D<float> local_b0;
  ulong local_98;
  ulong local_90;
  imagef *local_88;
  ulong local_80;
  ulong local_78;
  float *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  vec4F local_48;
  
  if ((odd_filter_width & 1) == 0) {
    __assert_fail("odd_filter_width && (odd_filter_width & 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_ssim.cpp"
                  ,0x5e,
                  "void basisu::gaussian_filter(imagef &, const imagef &, uint32_t, float, bool, uint32_t, uint32_t)"
                 );
  }
  vector2D<float>::vector2D(&local_b0,odd_filter_width,odd_filter_width);
  if (local_b0.m_values.m_size == 0) {
LAB_00255b6e:
    __function = "T &basisu::vector<float>::operator[](size_t) [T = float]";
LAB_00255b83:
    __assert_fail("i < m_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                  ,0x178,__function);
  }
  compute_gaussian_kernel(local_b0.m_values.m_p,odd_filter_width,odd_filter_width,sigma_sqr,1);
  w = orig_img->m_width / width_divisor;
  h = orig_img->m_height / height_divisor;
  local_48.m_v[0] = 0.0;
  local_48.m_v[1] = 0.0;
  local_48.m_v[2] = 0.0;
  local_48.m_v[3] = 1.0;
  imagef::crop(dst,w,h,0xffffffff,&local_48);
  if (0 < (int)h) {
    uVar15 = odd_filter_width >> 1;
    local_80 = (ulong)uVar15;
    local_90 = (ulong)width_divisor;
    local_58 = (ulong)odd_filter_width | 1;
    local_98 = (ulong)((width_divisor >> 1) - uVar15);
    uVar12 = 0;
    do {
      local_88 = dst;
      if (0 < (int)w) {
        uVar5 = uVar12 * height_divisor + (height_divisor >> 1);
        local_78 = (ulong)uVar5;
        uVar14 = 0;
        local_e0 = local_98;
        do {
          uVar8 = orig_img->m_width;
          local_50 = (ulong)uVar8;
          uVar3 = orig_img->m_height;
          local_70 = local_b0.m_values.m_p;
          fVar18 = 0.0;
          fVar19 = 0.0;
          fVar20 = 0.0;
          fVar21 = 0.0;
          uVar1 = 0;
          uVar4 = -uVar15;
          do {
            local_60 = uVar1;
            local_68 = (ulong)uVar4;
            iVar6 = uVar5 + uVar4;
            iVar16 = uVar3 - 1;
            if (iVar6 < (int)(uVar3 - 1)) {
              iVar16 = iVar6;
            }
            if (iVar6 < 0) {
              iVar16 = 0;
            }
            lVar13 = 0;
            do {
              uVar1 = local_e0 + lVar13;
              iVar7 = (int)uVar1;
              if (wrapping) {
                if (iVar7 < 0) {
                  iVar10 = (int)((long)((ulong)(uint)(iVar7 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
                                (long)(int)uVar8);
                  iVar7 = uVar8 + iVar10;
                  if (iVar10 == 0) {
                    iVar7 = 0;
                  }
                }
                else if ((int)uVar8 <= iVar7) {
                  iVar7 = (int)((long)((ulong)(uint)(iVar7 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
                               (long)(int)uVar8);
                }
              }
              else {
                iVar10 = uVar8 - 1;
                if (iVar7 < (int)(uVar8 - 1)) {
                  iVar10 = iVar7;
                }
                bVar17 = iVar7 < 0;
                iVar7 = iVar10;
                if (bVar17) {
                  iVar7 = 0;
                }
              }
              iVar10 = iVar16;
              if (wrapping) {
                if (iVar6 < 0) {
                  iVar10 = iVar6 % (int)uVar3 + uVar3;
                  if (iVar6 % (int)uVar3 == 0) {
                    iVar10 = 0;
                  }
                }
                else {
                  iVar10 = iVar6;
                  if ((int)uVar3 <= iVar6) {
                    iVar10 = iVar6 % (int)uVar3;
                  }
                }
              }
              uVar11 = iVar10 * orig_img->m_pitch + iVar7;
              if ((orig_img->m_pixels).m_size <= uVar11) {
                __assert_fail("i < m_size",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                              ,0x177,
                              "const T &basisu::vector<basisu::vec<4, float>>::operator[](size_t) const [T = basisu::vec<4, float>]"
                             );
              }
              if ((local_b0.m_width <= (uint)lVar13) || (local_b0.m_height <= uVar4 + uVar15)) {
                __assert_fail("x < m_width && y < m_height",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                              ,0xd2a,
                              "T &basisu::vector2D<float>::operator()(uint32_t, uint32_t) [T = float]"
                             );
              }
              if (local_b0.m_values.m_size <= (uint)lVar13 + (int)local_60) goto LAB_00255b6e;
              pvVar9 = (orig_img->m_pixels).m_p + uVar11;
              fVar2 = local_b0.m_values.m_p[(local_60 & 0xffffffff) + lVar13];
              fVar18 = fVar18 + fVar2 * pvVar9->m_v[0];
              fVar19 = fVar19 + fVar2 * pvVar9->m_v[1];
              fVar20 = fVar20 + fVar2 * pvVar9->m_v[2];
              fVar21 = fVar21 + fVar2 * pvVar9->m_v[3];
              lVar13 = lVar13 + 1;
            } while ((int)local_58 != (int)lVar13);
            bVar17 = uVar4 != uVar15;
            uVar1 = local_60 + local_b0.m_width;
            uVar4 = uVar4 + 1;
          } while (bVar17);
          if ((dst->m_width <= uVar14) || (dst->m_height <= uVar12)) {
            __assert_fail("x < m_width && y < m_height",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                          ,0xc3e,"vec4F &basisu::imagef::operator()(uint32_t, uint32_t)");
          }
          uVar8 = dst->m_pitch * uVar12 + uVar14;
          if ((dst->m_pixels).m_size <= uVar8) {
            __function = 
            "T &basisu::vector<basisu::vec<4, float>>::operator[](size_t) [T = basisu::vec<4, float>]"
            ;
            goto LAB_00255b83;
          }
          pvVar9 = (dst->m_pixels).m_p + uVar8;
          pvVar9->m_v[0] = fVar18;
          pvVar9->m_v[1] = fVar19;
          pvVar9->m_v[2] = fVar20;
          pvVar9->m_v[3] = fVar21;
          uVar14 = uVar14 + 1;
          local_e0 = local_e0 + local_90;
        } while ((int)uVar14 < (int)w);
      }
      uVar12 = uVar12 + 1;
    } while ((int)uVar12 < (int)h);
  }
  if (local_b0.m_values.m_p != (float *)0x0) {
    free(local_b0.m_values.m_p);
  }
  return;
}

Assistant:

void gaussian_filter(imagef &dst, const imagef &orig_img, uint32_t odd_filter_width, float sigma_sqr, bool wrapping, uint32_t width_divisor, uint32_t height_divisor)
	{
		assert(odd_filter_width && (odd_filter_width & 1));
		odd_filter_width |= 1;

		vector2D<float> kernel(odd_filter_width, odd_filter_width);
		compute_gaussian_kernel(kernel.get_ptr(), odd_filter_width, odd_filter_width, sigma_sqr, cComputeGaussianFlagNormalize);

		const int dst_width = orig_img.get_width() / width_divisor;
		const int dst_height = orig_img.get_height() / height_divisor;

		const int H = odd_filter_width / 2;
		const int L = -H;

		dst.crop(dst_width, dst_height);

//#pragma omp parallel for
		for (int oy = 0; oy < dst_height; oy++)
		{
			for (int ox = 0; ox < dst_width; ox++)
			{
				vec4F c(0.0f);

				for (int yd = L; yd <= H; yd++)
				{
					int y = oy * height_divisor + (height_divisor >> 1) + yd;

					for (int xd = L; xd <= H; xd++)
					{
						int x = ox * width_divisor + (width_divisor >> 1) + xd;

						const vec4F &p = orig_img.get_clamped_or_wrapped(x, y, wrapping, wrapping);

						float w = kernel(xd + H, yd + H);
						c[0] += p[0] * w;
						c[1] += p[1] * w;
						c[2] += p[2] * w;
						c[3] += p[3] * w;
					}
				}

				dst(ox, oy).set(c[0], c[1], c[2], c[3]);
			}
		}
	}